

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O2

bool dxil_spv::emit_ray_query_intersection_type_instruction
               (Impl *impl,CallInst *instruction,RayQueryIntersection intersection)

{
  bool bVar1;
  Id arg;
  Builder *this;
  Value *operand;
  Operation *this_00;
  Id ray_object_id;
  
  this = Converter::Impl::builder(impl);
  ray_object_id = 0;
  operand = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = build_ray_query_object(impl,operand,&ray_object_id,(uint32_t *)0x0);
  if (bVar1) {
    this_00 = Converter::Impl::allocate(impl,OpRayQueryGetIntersectionTypeKHR,(Value *)instruction);
    Operation::add_id(this_00,ray_object_id);
    arg = spv::Builder::makeUintConstant(this,intersection,false);
    Operation::add_id(this_00,arg);
    Converter::Impl::add(impl,this_00,false);
  }
  return bVar1;
}

Assistant:

bool emit_ray_query_intersection_type_instruction(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                  spv::RayQueryIntersection intersection)
{
	auto &builder = impl.builder();
	spv::Id ray_object_id = 0;
	if (!build_ray_query_object(impl, instruction->getOperand(1), ray_object_id))
		return false;

	auto *op = impl.allocate(spv::OpRayQueryGetIntersectionTypeKHR, instruction);
	op->add_id(ray_object_id);
	op->add_id(builder.makeUintConstant(intersection));
	impl.add(op);
	return true;
}